

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O3

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  int iVar1;
  undefined4 uVar2;
  ulong uVar3;
  sf_value val;
  sf_vec key;
  sf_parser sfp;
  sf_value local_70;
  sf_vec local_58;
  sf_parser local_48;
  
  uVar3 = (ulong)dest->urgency;
  uVar2 = dest->inc;
  sf_parser_init(&local_48,value,valuelen);
  do {
    while( true ) {
      do {
        iVar1 = sf_parser_dict(&local_48,&local_58,&local_70);
        if (iVar1 != 0) {
          if (iVar1 != -2) {
            return -0x1f5;
          }
          dest->urgency = (uint32_t)uVar3;
          dest->inc = uVar2;
          return 0;
        }
      } while (local_58.len != 1);
      if (*local_58.base == 'u') break;
      if ((*local_58.base == 'i') &&
         (uVar2 = local_70.field_2.boolean, local_70.type != SF_TYPE_BOOLEAN)) {
        return -0x1f5;
      }
    }
    if (local_70.type != SF_TYPE_INTEGER) {
      return -0x1f5;
    }
    uVar3 = CONCAT44(local_70.field_2.integer._4_4_,local_70.field_2.boolean);
  } while (uVar3 < 8);
  return -0x1f5;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  nghttp2_extpri pri = *dest;
  sf_parser sfp;
  sf_vec key;
  sf_value val;
  int rv;

  sf_parser_init(&sfp, value, valuelen);

  for (;;) {
    rv = sf_parser_dict(&sfp, &key, &val);
    if (rv != 0) {
      if (rv == SF_ERR_EOF) {
        break;
      }

      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (key.len != 1) {
      continue;
    }

    switch (key.base[0]) {
    case 'i':
      if (val.type != SF_TYPE_BOOLEAN) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }

      pri.inc = val.boolean;

      break;
    case 'u':
      if (val.type != SF_TYPE_INTEGER ||
          val.integer < NGHTTP2_EXTPRI_URGENCY_HIGH ||
          NGHTTP2_EXTPRI_URGENCY_LOW < val.integer) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }

      pri.urgency = (uint32_t)val.integer;

      break;
    }
  }

  *dest = pri;

  return 0;
}